

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O1

Gia_Man_t * Ssc_PerformSweepingConstr(Gia_Man_t *p,Ssc_Pars_t *pPars)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pGVar3;
  uint *__ptr;
  int *pPos;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  Gia_Man_t *pGVar7;
  Gia_Man_t *p_00;
  Gia_Man_t *pAig;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  
  if (pPars->fVerbose != 0) {
    Abc_Print(0,"SAT sweeping AIG with %d constraints.\n",(ulong)(uint)p->nConstrs);
  }
  iVar11 = p->nConstrs;
  if (iVar11 != 0) {
    pVVar2 = p->vCos;
    iVar1 = p->nRegs;
    uVar10 = pVVar2->nSize - iVar1;
    __ptr = (uint *)malloc(0x10);
    uVar8 = 0x10;
    if (0xe < uVar10 - 1) {
      uVar8 = uVar10;
    }
    __ptr[1] = 0;
    *__ptr = uVar8;
    if (uVar8 == 0) {
      pPos = (int *)0x0;
    }
    else {
      pPos = (int *)malloc((long)(int)uVar8 << 2);
    }
    *(int **)(__ptr + 2) = pPos;
    __ptr[1] = uVar10;
    if (0 < (int)uVar10) {
      uVar9 = 0;
      do {
        pPos[uVar9] = (int)uVar9;
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
    pGVar7 = Gia_ManDupCones(p,pPos,pVVar2->nSize - (iVar1 + iVar11),0);
    p_00 = Gia_ManDupCones(p,pPos + (((long)p->vCos->nSize - (long)p->nRegs) - (long)p->nConstrs),
                           p->nConstrs,0);
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
LAB_005b721c:
    if (pPars->fVerbose != 0) {
      printf("User AIG: ");
      Gia_ManPrintStats(pGVar7,(Gps_Par_t *)0x0);
      printf("Care AIG: ");
      Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
    }
    pAig = Gia_ManDupLevelized(pGVar7);
    Gia_ManStop(pGVar7);
    pGVar7 = Ssc_PerformSweeping(pAig,p_00,pPars);
    if (pPars->fAppend != 0) {
      Gia_ManDupAppendShare(pGVar7,p_00);
      pGVar7->nConstrs = p_00->vCos->nSize - p_00->nRegs;
    }
    Gia_ManStop(pAig);
    Gia_ManStop(p_00);
    return pGVar7;
  }
  pGVar7 = Gia_ManDup(p);
  p_00 = Gia_ManStart(p->vCis->nSize + 2);
  pcVar4 = (char *)malloc(5);
  builtin_strncpy(pcVar4,"care",5);
  p_00->pName = pcVar4;
  if (0 < p->vCis->nSize) {
    iVar11 = 0;
    do {
      pGVar5 = Gia_ManAppendObj(p_00);
      uVar9 = *(ulong *)pGVar5;
      *(ulong *)pGVar5 = uVar9 | 0x9fffffff;
      *(ulong *)pGVar5 =
           uVar9 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar3 = p_00->pObjs;
      if ((pGVar5 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar5)) goto LAB_005b7169;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar5 - (long)pGVar3) >> 2) * -0x55555555);
      if ((pGVar5 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar5)) goto LAB_005b7169;
      iVar11 = iVar11 + 1;
    } while (iVar11 < p->vCis->nSize);
  }
  if (p_00->nObjs < 1) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  if ((~*(uint *)p_00->pObjs & 0x1fffffff) != 0 && (int)*(uint *)p_00->pObjs < 0) {
    __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  pGVar5 = Gia_ManAppendObj(p_00);
  uVar9 = *(ulong *)pGVar5;
  *(ulong *)pGVar5 = uVar9 | 0x80000000;
  pGVar3 = p_00->pObjs;
  if ((pGVar3 <= pGVar5) && (pGVar5 < pGVar3 + p_00->nObjs)) {
    uVar6 = (ulong)(((uint)((int)pGVar5 - (int)pGVar3) >> 2) * -0x55555555 & 0x1fffffff);
    *(ulong *)pGVar5 = uVar9 & 0xffffffffc0000000 | 0x80000000 | uVar6;
    *(ulong *)pGVar5 =
         uVar9 & 0xe0000000c0000000 | 0x80000000 | uVar6 |
         (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
    pGVar3 = p_00->pObjs;
    if ((pGVar3 <= pGVar5) && (pGVar5 < pGVar3 + p_00->nObjs)) {
      Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar5 - (long)pGVar3) >> 2) * -0x55555555);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff),pGVar5);
      }
      if ((p_00->pObjs <= pGVar5) && (pGVar5 < p_00->pObjs + p_00->nObjs)) goto LAB_005b721c;
    }
  }
LAB_005b7169:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Ssc_PerformSweepingConstr( Gia_Man_t * p, Ssc_Pars_t * pPars )
{
    Gia_Man_t * pAig, * pCare, * pResult;
    int i;
    if ( pPars->fVerbose )
        Abc_Print( 0, "SAT sweeping AIG with %d constraints.\n", p->nConstrs );
    if ( p->nConstrs == 0 )
    {
        pAig = Gia_ManDup( p );
        pCare = Gia_ManStart( Gia_ManCiNum(p) + 2 );
        pCare->pName = Abc_UtilStrsav( "care" );
        for ( i = 0; i < Gia_ManCiNum(p); i++ )
            Gia_ManAppendCi( pCare );
        Gia_ManAppendCo( pCare, 0 );
    }
    else
    {
        Vec_Int_t * vOuts = Vec_IntStartNatural( Gia_ManPoNum(p) );
        pAig = Gia_ManDupCones( p, Vec_IntArray(vOuts), Gia_ManPoNum(p) - p->nConstrs, 0 );
        pCare = Gia_ManDupCones( p, Vec_IntArray(vOuts) + Gia_ManPoNum(p) - p->nConstrs, p->nConstrs, 0 );
        Vec_IntFree( vOuts );
    }
    if ( pPars->fVerbose )
    {
        printf( "User AIG: " );
        Gia_ManPrintStats( pAig, NULL );
        printf( "Care AIG: " );
        Gia_ManPrintStats( pCare, NULL );
    }

    pAig = Gia_ManDupLevelized( pResult = pAig );
    Gia_ManStop( pResult );
    pResult = Ssc_PerformSweeping( pAig, pCare, pPars );
    if ( pPars->fAppend )
    {
        Gia_ManDupAppendShare( pResult, pCare );
        pResult->nConstrs = Gia_ManPoNum(pCare);
    }
    Gia_ManStop( pAig );
    Gia_ManStop( pCare );
    return pResult;
}